

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O2

void duckdb::ArrayGenericFold<double,duckdb::DistanceOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  UnifiedVectorFormat *pUVar1;
  long lVar2;
  bool bVar3;
  BoundFunctionExpression *pBVar4;
  reference pvVar5;
  Vector *vector;
  Vector *vector_00;
  idx_t count;
  InvalidInputException *pIVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  UnifiedVectorFormat *pUVar7;
  idx_t from;
  UnifiedVectorFormat *pUVar8;
  UnifiedVectorFormat *pUVar9;
  idx_t from_00;
  double dVar10;
  allocator local_191;
  Vector *local_190;
  TemplatedValidityMask<unsigned_long> *local_188;
  TemplatedValidityMask<unsigned_long> *local_180;
  BoundFunctionExpression *local_178;
  long local_170;
  long local_168;
  string local_160;
  string local_140;
  string local_120 [32];
  string local_100;
  string local_e0 [32];
  UnifiedVectorFormat rhs_format;
  long local_b0;
  UnifiedVectorFormat lhs_format;
  long local_68;
  
  local_190 = result;
  pBVar4 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pUVar1 = *(UnifiedVectorFormat **)(args + 0x18);
  pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  vector = (Vector *)duckdb::ArrayVector::GetEntry(pvVar5);
  pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  vector_00 = (Vector *)duckdb::ArrayVector::GetEntry(pvVar5);
  local_180 = (TemplatedValidityMask<unsigned_long> *)vector;
  FlatVector::VerifyFlatVector(vector);
  local_188 = (TemplatedValidityMask<unsigned_long> *)vector_00;
  FlatVector::VerifyFlatVector(vector_00);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&lhs_format);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&rhs_format);
  pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar5,pUVar1);
  pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar5,pUVar1);
  local_168 = *(long *)((long)local_180 + 0x20);
  local_170 = *(long *)((long)local_188 + 0x20);
  lVar2 = *(long *)(local_190 + 0x20);
  pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  count = duckdb::ArrayType::GetSize((LogicalType *)(pvVar5 + 8));
  local_178 = pBVar4 + 0x60;
  local_180 = (TemplatedValidityMask<unsigned_long> *)((long)local_180 + 0x28);
  local_188 = (TemplatedValidityMask<unsigned_long> *)((long)local_188 + 0x28);
  pUVar8 = (UnifiedVectorFormat *)0x0;
  do {
    if (pUVar1 == pUVar8) {
      if (pUVar1 == (UnifiedVectorFormat *)0x1) {
        duckdb::Vector::SetVectorType((VectorType)local_190);
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&rhs_format);
      UnifiedVectorFormat::~UnifiedVectorFormat(&lhs_format);
      return;
    }
    pUVar7 = pUVar8;
    if (*_lhs_format != 0) {
      pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_lhs_format + (long)pUVar8 * 4);
    }
    pUVar9 = pUVar8;
    if (*_rhs_format != 0) {
      pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_rhs_format + (long)pUVar8 * 4);
    }
    if (((local_68 == 0) ||
        (in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((ulong)pUVar7 >> 6),
        (*(ulong *)(local_68 + (long)in_RCX * 8) >> ((ulong)pUVar7 & 0x3f) & 1) != 0)) &&
       ((local_b0 == 0 ||
        (in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((ulong)pUVar9 >> 6),
        (*(ulong *)(local_b0 + (long)in_RCX * 8) >> ((ulong)pUVar9 & 0x3f) & 1) != 0)))) {
      from = (long)pUVar7 * count;
      bVar3 = TemplatedValidityMask<unsigned_long>::CheckAllValid(local_180,from + count,from);
      if (!bVar3) {
        pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  (local_e0,"%s: left argument can not contain NULL values",&local_191);
        std::__cxx11::string::string((string *)&local_100,(string *)local_178);
        StringUtil::Format<std::__cxx11::string>
                  (&local_160,(StringUtil *)local_e0,&local_100,in_RCX);
        duckdb::InvalidInputException::InvalidInputException(pIVar6,(string *)&local_160);
        __cxa_throw(pIVar6,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      from_00 = (long)pUVar9 * count;
      bVar3 = TemplatedValidityMask<unsigned_long>::CheckAllValid(local_188,from_00 + count,from_00)
      ;
      if (!bVar3) {
        pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  (local_120,"%s: right argument can not contain NULL values",&local_191);
        std::__cxx11::string::string((string *)&local_140,(string *)local_178);
        StringUtil::Format<std::__cxx11::string>
                  (&local_160,(StringUtil *)local_120,&local_140,in_RCX);
        duckdb::InvalidInputException::InvalidInputException(pIVar6,(string *)&local_160);
        __cxa_throw(pIVar6,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      dVar10 = DistanceOp::Operation<double>
                         ((double *)(local_168 + from * 8),(double *)(local_170 + from_00 * 8),count
                         );
      *(double *)(lVar2 + (long)pUVar8 * 8) = dVar10;
    }
    else {
      duckdb::FlatVector::SetNull(local_190,(ulong)pUVar8,true);
    }
    pUVar8 = pUVar8 + 1;
  } while( true );
}

Assistant:

static void ArrayGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(result);

	const auto array_size = ArrayType::GetSize(args.data[0].GetType());
	D_ASSERT(array_size == ArrayType::GetSize(args.data[1].GetType()));

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * array_size;
		if (!lhs_child_validity.CheckAllValid(left_offset + array_size, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * array_size;
		if (!rhs_child_validity.CheckAllValid(right_offset + array_size, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;

		res_data[i] = OP::Operation(lhs_data_ptr, rhs_data_ptr, array_size);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}